

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O2

int lj_cf_jit_util_traceinfo(lua_State *L)

{
  TValue *pTVar1;
  char *__s;
  GCtrace *pGVar2;
  size_t lenx;
  GCstr *pGVar3;
  GCtab *t;
  
  pGVar2 = jit_checktrace(L);
  if (pGVar2 != (GCtrace *)0x0) {
    lua_createtable(L,0,8);
    t = (GCtab *)(L->top[-1].u64 & 0x7fffffffffff);
    setintfield(L,t,"nins",pGVar2->nins - 0x8001);
    setintfield(L,t,"nk",0x8000 - pGVar2->nk);
    setintfield(L,t,"link",(uint)pGVar2->link);
    setintfield(L,t,"nexit",(uint)pGVar2->nsnap);
    pTVar1 = L->top;
    L->top = pTVar1 + 1;
    __s = jit_trlinkname[pGVar2->linktype];
    lenx = strlen(__s);
    pGVar3 = lj_str_new(L,__s,lenx);
    pTVar1->u64 = (ulong)pGVar3 | 0xfffd800000000000;
    lua_setfield(L,-2,"linktype");
  }
  return (uint)(pGVar2 != (GCtrace *)0x0);
}

Assistant:

LJLIB_CF(jit_util_traceinfo)
{
  GCtrace *T = jit_checktrace(L);
  if (T) {
    GCtab *t;
    lua_createtable(L, 0, 8);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintfield(L, t, "nins", (int32_t)T->nins - REF_BIAS - 1);
    setintfield(L, t, "nk", REF_BIAS - (int32_t)T->nk);
    setintfield(L, t, "link", T->link);
    setintfield(L, t, "nexit", T->nsnap);
    setstrV(L, L->top++, lj_str_newz(L, jit_trlinkname[T->linktype]));
    lua_setfield(L, -2, "linktype");
    /* There are many more fields. Add them only when needed. */
    return 1;
  }
  return 0;
}